

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray
          (DescriptorProto_ReservedRange *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  uint32 uVar2;
  uint8 *in_RSI;
  DescriptorProto_ReservedRange *in_RDI;
  uint32 cached_has_bits;
  uint8 **in_stack_ffffffffffffff08;
  EpsCopyOutputStream *in_stack_ffffffffffffff10;
  int32 value;
  uint8 *local_d0;
  EpsCopyOutputStream *stream_00;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 uVar3;
  HasBits<1UL> *unknown_fields;
  
  unknown_fields = &in_RDI->_has_bits_;
  uVar3 = 0;
  uVar1 = unknown_fields->has_bits_[0];
  local_d0 = in_RSI;
  if ((uVar1 & 1) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    _internal_start(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(1,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,in_RSI);
    local_d0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                         ((int32)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                          (uint8 *)in_stack_ffffffffffffff08);
  }
  if ((uVar1 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    value = (int32)((ulong)in_stack_ffffffffffffff10 >> 0x20);
    _internal_end(in_RDI);
    uVar2 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    io::CodedOutputStream::WriteVarint32ToArray(uVar2,local_d0);
    local_d0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray
                         (value,(uint8 *)in_stack_ffffffffffffff08);
  }
  if (((uint)(in_RDI->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    stream_00 = (EpsCopyOutputStream *)&in_RDI->_internal_metadata_;
    if (((uint)(((InternalMetadataWithArena *)stream_00)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      internal::
      InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
      ::
      PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                  *)stream_00);
    }
    else {
      internal::InternalMetadataWithArena::default_instance();
    }
    local_d0 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)unknown_fields,
                          (uint8 *)CONCAT44(uVar3,in_stack_ffffffffffffff60),stream_00);
  }
  return local_d0;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* DescriptorProto_ReservedRange::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.DescriptorProto.ReservedRange)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 start = 1;
  if (cached_has_bits & 0x00000001u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(1, this->_internal_start(), target);
  }

  // optional int32 end = 2;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(2, this->_internal_end(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.DescriptorProto.ReservedRange)
  return target;
}